

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsettings.cpp
# Opt level: O0

void QSettings::setPath(Format format,Scope scope,QString *path)

{
  bool bVar1;
  QHash<int,_(anonymous_namespace)::Path> *this;
  Scope in_ESI;
  Format in_EDI;
  long in_FS_OFFSET;
  PathHash *pathHash;
  unique_lock<QBasicMutex> locker;
  QStringBuilder<const_QString_&,_QChar> *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  unique_lock<QBasicMutex> *in_stack_fffffffffffffed8;
  Path *in_stack_fffffffffffffee0;
  unique_lock<QBasicMutex> *in_stack_ffffffffffffffc0;
  unique_lock<QBasicMutex> local_38 [2];
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  (anonymous_namespace)::qt_unique_lock<QBasicMutex,std::unique_lock<QBasicMutex>>
            ((QBasicMutex *)in_stack_fffffffffffffec8);
  this = (QHash<int,_(anonymous_namespace)::Path> *)
         QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_pathHashFunc>_>::
         operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_pathHashFunc>_>
                     *)in_stack_fffffffffffffec8);
  bVar1 = QHash<int,_(anonymous_namespace)::Path>::isEmpty(this);
  if (bVar1) {
    std::unique_lock<QBasicMutex>::unique_lock(local_38,(unique_lock<QBasicMutex> *)local_18);
    initDefaultPaths(in_stack_ffffffffffffffc0);
    std::unique_lock<QBasicMutex>::operator=
              (in_stack_fffffffffffffed8,
               (unique_lock<QBasicMutex> *)
               CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
    std::unique_lock<QBasicMutex>::~unique_lock
              ((unique_lock<QBasicMutex> *)
               CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
    std::unique_lock<QBasicMutex>::~unique_lock
              ((unique_lock<QBasicMutex> *)
               CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
  }
  pathHashKey(in_EDI,in_ESI);
  QDir::separator();
  ::operator+((QString *)in_stack_fffffffffffffed8,
              (QChar *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
  ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffec8);
  anon_unknown.dwarf_11d0eb9::Path::Path
            (in_stack_fffffffffffffee0,(QString *)in_stack_fffffffffffffed8,
             (bool)in_stack_fffffffffffffed7);
  QHash<int,_(anonymous_namespace)::Path>::insert
            ((QHash<QByteArray,_QTzTimeZone> *)
             CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
             (int *)in_stack_fffffffffffffec8,(Path *)0x7b3dd1);
  anon_unknown.dwarf_11d0eb9::Path::~Path((Path *)0x7b3dfe);
  QString::~QString((QString *)0x7b3e0b);
  std::unique_lock<QBasicMutex>::~unique_lock
            ((unique_lock<QBasicMutex> *)
             CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSettings::setPath(Format format, Scope scope, const QString &path)
{
    auto locker = qt_unique_lock(settingsGlobalMutex);
    PathHash *pathHash = pathHashFunc();
    if (pathHash->isEmpty())
        locker = initDefaultPaths(std::move(locker));
    pathHash->insert(pathHashKey(format, scope), Path(path + QDir::separator(), true));
}